

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O1

Halves * __thiscall Num::getHalf(Halves *__return_storage_ptr__,Num *this,Short length)

{
  string *psVar1;
  string *psVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  ulong uVar4;
  string s2;
  string s1;
  string local_110;
  string local_f0;
  Num local_d0;
  Num local_a8;
  pair<Num,_Num> local_80;
  
  uVar4 = CONCAT62(in_register_00000012,length) >> 1;
  (__return_storage_ptr__->first).size = 0;
  psVar1 = &(__return_storage_ptr__->first).base;
  (__return_storage_ptr__->first).base._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).base.field_2;
  (__return_storage_ptr__->first).base._M_string_length = 0;
  (__return_storage_ptr__->first).base.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second).size = 0;
  psVar2 = &(__return_storage_ptr__->second).base;
  (__return_storage_ptr__->second).base._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).base.field_2;
  (__return_storage_ptr__->second).base._M_string_length = 0;
  (__return_storage_ptr__->second).base.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  if ((length & 1) == 0) {
    if (1 < length) {
      uVar3 = 0;
      do {
        std::__cxx11::string::push_back((char)&local_f0);
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0xffff) != uVar3);
    }
    if (length != 0) {
      uVar4 = (ulong)(length >> 1);
      do {
        if (uVar4 < (ushort)(this->base)._M_string_length) {
          std::__cxx11::string::push_back((char)&local_110);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < length);
    }
    Num(&local_a8,&local_f0,(Short)local_f0._M_string_length);
    Num(&local_d0,&local_110,(Short)local_110._M_string_length);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_80,&local_a8,&local_d0);
    (__return_storage_ptr__->first).size = local_80.first.size;
    std::__cxx11::string::_M_assign((string *)psVar1);
    (__return_storage_ptr__->second).size = local_80.second.size;
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  else {
    if (1 < length) {
      uVar3 = 0;
      do {
        std::__cxx11::string::push_back((char)&local_f0);
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0xffff) != uVar3);
    }
    if ((ushort)uVar4 <= (length & 0xfffe)) {
      uVar4 = (ulong)(length >> 1);
      do {
        if (uVar4 < (ushort)(this->base)._M_string_length) {
          std::__cxx11::string::push_back((char)&local_110);
        }
        uVar4 = uVar4 + 1;
      } while ((length | 1) != (ushort)uVar4);
    }
    Num(&local_a8,&local_f0,(Short)local_f0._M_string_length);
    Num(&local_d0,&local_110,(Short)local_110._M_string_length);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_80,&local_a8,&local_d0);
    (__return_storage_ptr__->first).size = local_80.first.size;
    std::__cxx11::string::_M_assign((string *)psVar1);
    (__return_storage_ptr__->second).size = local_80.second.size;
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second.base._M_dataplus._M_p != &local_80.second.base.field_2) {
    operator_delete(local_80.second.base._M_dataplus._M_p,
                    local_80.second.base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first.base._M_dataplus._M_p != &local_80.first.base.field_2) {
    operator_delete(local_80.first.base._M_dataplus._M_p,
                    local_80.first.base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.base._M_dataplus._M_p != &local_d0.base.field_2) {
    operator_delete(local_d0.base._M_dataplus._M_p,local_d0.base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.base._M_dataplus._M_p != &local_a8.base.field_2) {
    operator_delete(local_a8.base._M_dataplus._M_p,local_a8.base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Halves Num::getHalf(Short length) const  // separate number to halves and reсturn them as a pair of numbers
{
    Short k = length / 2;
    Halves pair;
    std::string s1, s2;
    if (length % 2)
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i <= 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2,s2.length())};

    }
    else
    {
        for (Short i = 0; i < k; ++i)
            s1 += (Num::getDigit(i) + '0');
        for (Short i = k; i < 2 * k; ++i)
            if (i < getSize())
            {
                s2 += (Num::getDigit(i) + '0');
            }


        pair = {Num(s1, s1.length()), Num(s2, s2.length())};
    }
    return pair;
}